

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_formatter.h
# Opt level: O3

void ST::apply_format<std::__cxx11::u32string>
               (format_writer *data,
               basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *arg0)

{
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  *paVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  out_of_range *this;
  undefined8 uVar5;
  long lVar6;
  formatter_ref_t formatters [1];
  format_spec spec;
  _Any_data _Stack_88;
  code *local_78;
  code *local_70;
  pointer local_68;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *local_60;
  size_type local_58;
  undefined8 uStack_50;
  format_spec local_44;
  
  local_68 = (arg0->_M_dataplus)._M_p;
  paVar1 = &arg0->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_68 == paVar1) {
    local_58 = paVar1->_M_allocated_capacity;
    uStack_50 = *(undefined8 *)((long)&arg0->field_2 + 8);
    local_68 = (pointer)&local_58;
  }
  else {
    local_58 = paVar1->_M_allocated_capacity;
  }
  local_60 = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             arg0->_M_string_length;
  (arg0->_M_dataplus)._M_p = (pointer)paVar1;
  arg0->_M_string_length = 0;
  (arg0->field_2)._M_local_buf[0] = L'\0';
  make_formatter_ref<std::__cxx11::u32string>
            ((formatter_ref_t *)&_Stack_88,(ST *)&local_68,local_60);
  if (local_68 != (pointer)&local_58) {
    operator_delete(local_68,local_58 * 4 + 4);
  }
  lVar6 = 0;
  while( true ) {
    bVar3 = format_writer::next_format(data);
    if (!bVar3) {
      if (local_78 != (code *)0x0) {
        (*local_78)(&_Stack_88,&_Stack_88,__destroy_functor);
      }
      return;
    }
    format_writer::parse_format(&local_44,data);
    iVar2 = local_44.arg_index;
    lVar4 = (long)local_44.arg_index + -1;
    if ((long)local_44.arg_index < 0) {
      lVar4 = lVar6;
    }
    if (lVar4 != 0) break;
    if (local_78 == (code *)0x0) {
      uVar5 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar5);
    }
    (*local_70)(&_Stack_88,&local_44,data);
    lVar6 = lVar6 + (ulong)((uint)iVar2 >> 0x1f);
  }
  this = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this,"Parameter index out of range");
  __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void apply_format(ST::format_writer &data, arg0_T &&arg0, args_T &&...args)
    {
        enum { num_formatters = 1 + sizeof...(args) };
        formatter_ref_t formatters[num_formatters] = {
            make_formatter_ref(std::forward<arg0_T>(arg0)),
            make_formatter_ref(std::forward<args_T>(args))...
        };
        size_t index = 0;
        while (data.next_format()) {
            ST::format_spec spec = data.parse_format();
            size_t formatter_id = (spec.arg_index >= 0)
                                  ? spec.arg_index - 1
                                  : index++;
            if (formatter_id >= num_formatters)
                throw std::out_of_range("Parameter index out of range");
            formatters[formatter_id](spec, data);
        }
    }